

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFE.cpp
# Opt level: O2

void __thiscall Storage::Disk::HFE::HFE(HFE *this,string *file_name)

{
  FileHolder *this_00;
  undefined4 uVar1;
  bool bVar2;
  uint8_t uVar3;
  byte bVar4;
  uint16_t uVar5;
  undefined4 *puVar6;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__HFE_0058e588;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  bVar2 = FileHolder::check_signature(this_00,"HXCPICFE",0);
  if (bVar2) {
    uVar3 = FileHolder::get8(this_00);
    if (uVar3 == '\0') {
      bVar4 = FileHolder::get8(this_00);
      this->track_count_ = (uint)bVar4;
      bVar4 = FileHolder::get8(this_00);
      this->head_count_ = (uint)bVar4;
      FileHolder::seek(this_00,7,1);
      uVar5 = FileHolder::get16le(this_00);
      this->track_list_offset_ = (ulong)uVar5 << 9;
      return;
    }
    uVar1 = 0xfffffffd;
  }
  else {
    uVar1 = 0xfffffffe;
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = uVar1;
  __cxa_throw(puVar6,&Error::typeinfo,0);
}

Assistant:

HFE::HFE(const std::string &file_name) :
		file_(file_name) {
	if(!file_.check_signature("HXCPICFE")) throw Error::InvalidFormat;

	if(file_.get8()) throw Error::UnknownVersion;
	track_count_ = file_.get8();
	head_count_ = file_.get8();

	file_.seek(7, SEEK_CUR);
	track_list_offset_ = long(file_.get16le()) << 9;
}